

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::read_content
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  bool bVar1;
  byte bVar2;
  char *key;
  long lVar3;
  string *in_RCX;
  byte in_DL;
  string *in_RDI;
  long in_R8;
  ContentReceiver *in_stack_00000010;
  Progress *in_stack_00000018;
  int *in_stack_00000020;
  size_t in_stack_00000028;
  Request *in_stack_00000030;
  Stream *in_stack_00000038;
  string boundary;
  string *content_type;
  undefined7 in_stack_00000108;
  Response *in_stack_00000238;
  Request *in_stack_00000240;
  undefined1 in_stack_0000024f;
  Stream *in_stack_00000250;
  Server *in_stack_00000258;
  function<bool_(unsigned_long,_unsigned_long)> *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  string *content_type_00;
  Request *this_00;
  string local_d0 [32];
  string local_b0 [32];
  string *local_90;
  string *local_78;
  long local_30;
  string *local_28;
  undefined1 local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  content_type_00 = *(string **)(in_RDI + 2);
  key = (char *)(in_R8 + 0x20);
  this_00 = (Request *)&stack0xffffffffffffffb0;
  local_30 = in_R8;
  local_28 = in_RCX;
  std::function<bool_(unsigned_long,_unsigned_long)>::function(in_stack_fffffffffffffee0);
  local_78 = local_28;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,bool,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_1_,void>
            ((function<bool_(const_char_*,_unsigned_long)> *)in_RDI,
             (anon_class_8_1_ba1d73fe *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  bVar1 = detail::read_content<httplib::Request>
                    (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                     in_stack_00000018,in_stack_00000010);
  bVar2 = bVar1 ^ 0xff;
  std::function<bool_(const_char_*,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long)> *)0x1e5f7f);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function
            ((function<bool_(unsigned_long,_unsigned_long)> *)0x1e5f8c);
  if ((bVar2 & 1) != 0) {
    local_1 = write_response(in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f,
                             in_stack_00000240,in_stack_00000238);
    goto LAB_001e61cc;
  }
  Request::get_header_value_abi_cxx11_(this_00,key,(size_t)content_type_00);
  local_90 = local_b0;
  lVar3 = std::__cxx11::string::find((char *)local_90,0x280ad4);
  if (lVar3 == 0) {
    detail::parse_query_text
              (in_RDI,(Params *)
                      CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)))
    ;
LAB_001e61a4:
    local_1 = 1;
  }
  else {
    lVar3 = std::__cxx11::string::find((char *)local_90,0x280af6);
    if (lVar3 != 0) goto LAB_001e61a4;
    std::__cxx11::string::string(local_d0);
    bVar1 = detail::parse_multipart_boundary(content_type_00,in_RCX);
    if ((bVar1) &&
       (bVar1 = detail::parse_multipart_formdata
                          ((string *)this,(string *)strm,
                           (MultipartFiles *)CONCAT17(last_connection,in_stack_00000108)), bVar1)) {
      bVar1 = false;
    }
    else {
      *(undefined4 *)(local_30 + 0x20) = 400;
      local_1 = write_response(in_stack_00000258,in_stack_00000250,(bool)in_stack_0000024f,
                               in_stack_00000240,in_stack_00000238);
      bVar1 = true;
    }
    std::__cxx11::string::~string(local_d0);
    if (!bVar1) goto LAB_001e61a4;
  }
  std::__cxx11::string::~string(local_b0);
LAB_001e61cc:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Server::read_content(Stream &strm, bool last_connection,
                                 Request &req, Response &res) {
  if (!detail::read_content(strm, req, payload_max_length_, res.status,
                            Progress(), [&](const char *buf, size_t n) {
                              if (req.body.size() + n > req.body.max_size()) {
                                return false;
                              }
                              req.body.append(buf, n);
                              return true;
                            })) {
    return write_response(strm, last_connection, req, res);
  }

  const auto &content_type = req.get_header_value("Content-Type");

  if (!content_type.find("application/x-www-form-urlencoded")) {
    detail::parse_query_text(req.body, req.params);
  } else if (!content_type.find("multipart/form-data")) {
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary) ||
        !detail::parse_multipart_formdata(boundary, req.body, req.files)) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }
  }

  return true;
}